

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dependency_graph.cpp
# Opt level: O0

void __thiscall
Clasp::Asp::PrgDepGraph::NonHcfComponent::ComponentMap::addBodyConstraints
          (ComponentMap *this,Solver *generator,SccGraph *dep,uint32 scc,SharedContext *comp)

{
  bool bVar1;
  BodyNode *this_00;
  NodeId *pNVar2;
  AtomNode *pAVar3;
  NodeId *pNVar4;
  iterator last;
  uint in_ECX;
  pod_vector<Clasp::Asp::PrgDepGraph::NonHcfComponent::ComponentMap::Mapping,_std::allocator<Clasp::Asp::PrgDepGraph::NonHcfComponent::ComponentMap::Mapping>_>
  *in_RDI;
  MapRange MVar5;
  Result RVar6;
  NodeId *other;
  MapIt_c atMapped_2;
  NodeId *dHead;
  MapIt_c atMapped_1;
  MapIt_c atMapped;
  NodeId *aIt;
  uint32 hScc;
  NodeId *hEnd;
  NodeId *hIt;
  BodyNode *B;
  MapRange r;
  MapIt j;
  ClauseCreator dc;
  ClauseCreator cc;
  undefined4 in_stack_fffffffffffffdd8;
  ConstraintType in_stack_fffffffffffffddc;
  PrgDepGraph *in_stack_fffffffffffffde0;
  Solver *in_stack_fffffffffffffde8;
  ComponentMap *in_stack_fffffffffffffdf0;
  undefined4 in_stack_fffffffffffffdf8;
  Status in_stack_fffffffffffffdfc;
  ClauseCreator *in_stack_fffffffffffffe00;
  uint local_184;
  NodeId *local_110;
  NodeId *local_c0;
  NodeId *local_a8;
  Mapping *local_90;
  iterator local_80;
  ClauseCreator local_48;
  uint local_1c;
  
  local_1c = in_ECX;
  SharedContext::master((SharedContext *)0x15e10b);
  ClauseCreator::ClauseCreator
            (in_stack_fffffffffffffe00,
             (Solver *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
  ClauseCreator::addDefaultFlags(&local_48,0x100);
  SharedContext::master((SharedContext *)0x15e144);
  ClauseCreator::ClauseCreator
            (in_stack_fffffffffffffe00,
             (Solver *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
  local_80 = bk_lib::
             pod_vector<Clasp::Asp::PrgDepGraph::NonHcfComponent::ComponentMap::Mapping,_std::allocator<Clasp::Asp::PrgDepGraph::NonHcfComponent::ComponentMap::Mapping>_>
             ::begin(in_RDI);
  local_80 = local_80 + *(uint *)&in_RDI[1].ebo_.buf;
  MVar5 = bodies(in_stack_fffffffffffffdf0);
  local_90 = MVar5.first;
  do {
    if (local_90 == MVar5.second) {
      last = bk_lib::
             pod_vector<Clasp::Asp::PrgDepGraph::NonHcfComponent::ComponentMap::Mapping,_std::allocator<Clasp::Asp::PrgDepGraph::NonHcfComponent::ComponentMap::Mapping>_>
             ::end(in_RDI);
      bk_lib::
      pod_vector<Clasp::Asp::PrgDepGraph::NonHcfComponent::ComponentMap::Mapping,_std::allocator<Clasp::Asp::PrgDepGraph::NonHcfComponent::ComponentMap::Mapping>_>
      ::erase((pod_vector<Clasp::Asp::PrgDepGraph::NonHcfComponent::ComponentMap::Mapping,_std::allocator<Clasp::Asp::PrgDepGraph::NonHcfComponent::ComponentMap::Mapping>_>
               *)in_stack_fffffffffffffe00,
              (iterator)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),last);
      ClauseCreator::~ClauseCreator((ClauseCreator *)0x15e8a6);
      ClauseCreator::~ClauseCreator((ClauseCreator *)0x15e8b3);
      return;
    }
    this_00 = getBody(in_stack_fffffffffffffde0,in_stack_fffffffffffffddc);
    bVar1 = Solver::isFalse(in_stack_fffffffffffffde8,
                            (Literal)(uint32)((ulong)in_stack_fffffffffffffdf0 >> 0x20));
    if (!bVar1) {
      bVar1 = BodyNode::extended(this_00);
      if (bVar1) {
        Potassco::fail(-2,
                       "void Clasp::Asp::PrgDepGraph::NonHcfComponent::ComponentMap::addBodyConstraints(const Solver &, const SccGraph &, uint32, SharedContext &)"
                       ,0x201,"!B.extended()",
                       "Extended bodies not supported - use \'--trans-ext=weight\'",0);
      }
      local_a8 = BodyNode::heads_begin(this_00);
      pNVar2 = BodyNode::heads_end((BodyNode *)in_stack_fffffffffffffde0);
      for (; local_a8 != pNVar2; local_a8 = local_a8 + 1) {
        if (*local_a8 == 0) {
          pAVar3 = getAtom(in_stack_fffffffffffffde0,in_stack_fffffffffffffddc);
          local_184 = *(uint *)&(pAVar3->super_Node).field_0x4;
        }
        else {
          pAVar3 = getAtom(in_stack_fffffffffffffde0,in_stack_fffffffffffffddc);
          local_184 = *(uint *)&(pAVar3->super_Node).field_0x4;
        }
        local_184 = local_184 & 0xfffffff;
        if (local_184 == local_1c) {
          ClauseCreator::start((ClauseCreator *)in_stack_fffffffffffffde0,in_stack_fffffffffffffddc)
          ;
          Mapping::fb((Mapping *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
          ClauseCreator::add((ClauseCreator *)in_stack_fffffffffffffde0,
                             (Literal *)
                             CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
          if ((*(uint *)&(this_00->super_Node).field_0x4 & 0xfffffff) == local_1c) {
            for (local_c0 = BodyNode::preds(this_00); *local_c0 != 0xffffffff;
                local_c0 = local_c0 + 1) {
              findAtom((ComponentMap *)in_stack_fffffffffffffe00,in_stack_fffffffffffffdfc);
              Mapping::up((Mapping *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
              ClauseCreator::add((ClauseCreator *)in_stack_fffffffffffffde0,
                                 (Literal *)
                                 CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
            }
          }
          if (*local_a8 == 0) {
            pNVar4 = local_a8 + 1;
            for (local_a8 = pNVar4; *local_a8 != 0; local_a8 = local_a8 + 1) {
              ClauseCreator::start
                        ((ClauseCreator *)in_stack_fffffffffffffde0,in_stack_fffffffffffffddc);
              ClauseCreator::operator=
                        ((ClauseCreator *)in_stack_fffffffffffffde0,
                         (ClauseCreator *)
                         CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
              findAtom((ComponentMap *)in_stack_fffffffffffffe00,in_stack_fffffffffffffdfc);
              Mapping::up((Mapping *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
              Literal::operator~((Literal *)
                                 CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
              ClauseCreator::add((ClauseCreator *)in_stack_fffffffffffffde0,
                                 (Literal *)
                                 CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
              for (local_110 = pNVar4; *local_110 != 0; local_110 = local_110 + 1) {
                if (*local_110 != *local_a8) {
                  findAtom((ComponentMap *)in_stack_fffffffffffffe00,in_stack_fffffffffffffdfc);
                  Mapping::hp((Mapping *)
                              CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
                  ClauseCreator::add((ClauseCreator *)in_stack_fffffffffffffde0,
                                     (Literal *)
                                     CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
                }
              }
              RVar6 = ClauseCreator::end(in_stack_fffffffffffffe00,in_stack_fffffffffffffdfc);
              in_stack_fffffffffffffe00 = (ClauseCreator *)RVar6.local;
              in_stack_fffffffffffffdfc = RVar6.status;
            }
          }
          else {
            findAtom((ComponentMap *)in_stack_fffffffffffffe00,in_stack_fffffffffffffdfc);
            Mapping::up((Mapping *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
            Literal::operator~((Literal *)
                               CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
            ClauseCreator::add((ClauseCreator *)in_stack_fffffffffffffde0,
                               (Literal *)
                               CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
            ClauseCreator::end(in_stack_fffffffffffffe00,in_stack_fffffffffffffdfc);
          }
        }
        else if (*local_a8 == 0) {
          do {
            local_a8 = local_a8 + 1;
          } while (*local_a8 != 0);
        }
      }
      bVar1 = Mapping::eq(local_90);
      in_stack_fffffffffffffdf8 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffdf8);
      if (!bVar1) {
        *local_80 = *local_90;
        local_80 = local_80 + 1;
      }
    }
    local_90 = local_90 + 1;
  } while( true );
}

Assistant:

void PrgDepGraph::NonHcfComponent::ComponentMap::addBodyConstraints(const Solver& generator, const SccGraph& dep, uint32 scc, SharedContext& comp) {
	ClauseCreator cc(comp.master());
	cc.addDefaultFlags(ClauseCreator::clause_force_simplify);
	ClauseCreator dc(comp.master());
	MapIt j = mapping.begin() + numAtoms;
	for (MapRange r = bodies(); r.first != r.second; ++r.first) {
		const BodyNode& B = dep.getBody(r.first->node);
		if (generator.isFalse(B.lit)) { continue; }
		POTASSCO_REQUIRE(!B.extended(), "Extended bodies not supported - use '--trans-ext=weight'");
		for (const NodeId* hIt = B.heads_begin(), *hEnd = B.heads_end(); hIt != hEnd; ++hIt) {
			uint32 hScc = *hIt ? dep.getAtom(*hIt).scc : dep.getAtom(hIt[1]).scc;
			if (hScc != scc) {
				// the head is not relevant to this non-hcf - skip it
				if (!*hIt) { do { ++hIt; } while (*hIt); }
				continue;
			}
			// [fb(B) v ~up(a) V hp(o) for all o != a in B.disHead V up(b) for each b in B+ ^ C]
			cc.start().add(r.first->fb());
			if (B.scc == scc) { // add subgoals from same scc
				for (const NodeId* aIt = B.preds(); *aIt != idMax; ++aIt) {
					MapIt_c atMapped = findAtom(*aIt);
					cc.add(atMapped->up());
				}
			}
			if (*hIt) { // normal head
				MapIt_c atMapped = findAtom(*hIt);
				assert(atMapped != atoms().second);
				cc.add(~atMapped->up());
				cc.end();
			}
			else { // disjunctive head
				const NodeId* dHead = ++hIt;
				for (; *hIt; ++hIt) {
					dc.start();
					dc = cc;
					MapIt_c atMapped = findAtom(*hIt);
					dc.add(~atMapped->up());
					for (const NodeId* other = dHead; *other; ++other) {
						if (*other != *hIt) {
							assert(dep.getAtom(*other).scc == scc);
							atMapped = findAtom(*other);
							dc.add(atMapped->hp());
						}
					}
					dc.end();
				}
			}
		}
		if (!r.first->eq()) { *j++ = *r.first; }
	}
	mapping.erase(j, mapping.end());
}